

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt __thiscall llvm::APIntOps::RoundDoubleToAPInt(APIntOps *this,double Double,uint width)

{
  void *__dest;
  undefined8 extraout_RDX;
  uint64_t val;
  ulong uVar1;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar2;
  undefined8 extraout_RDX_06;
  uint uVar3;
  APInt AVar4;
  APInt Tmp;
  anon_union_8_2_1313ab2f_for_U local_50;
  uint local_48;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  anon_union_8_2_1313ab2f_for_U local_30;
  undefined4 local_28;
  
  uVar3 = (uint)((ulong)Double >> 0x34) & 0x7ff;
  if (0x3fe < (ulong)uVar3) {
    val = ((ulong)Double & 0xfffffffffffff) + 0x10000000000000;
    if (uVar3 < 0x433) {
      uVar1 = val >> (0x33U - (char)uVar3 & 0x3f);
      if ((long)Double < 0) {
        APInt::APInt((APInt *)&local_30,width,uVar1,false);
        APInt::flipAllBits((APInt *)&local_30);
        APInt::operator++((APInt *)&local_30);
        *(undefined4 *)(this + 8) = local_28;
        *(anon_union_8_2_1313ab2f_for_U *)this = local_30;
        uVar2 = extraout_RDX_02;
      }
      else {
        APInt::APInt((APInt *)this,width,uVar1,false);
        uVar2 = extraout_RDX_00;
      }
      goto LAB_0019d99e;
    }
    if ((long)((ulong)uVar3 - 0x433) < (long)(ulong)width) {
      APInt::APInt((APInt *)&local_50,width,val,false);
      APInt::operator<<=((APInt *)&local_50,uVar3 - 0x433);
      if ((long)Double < 0) {
        local_38 = local_48;
        if (local_48 < 0x41) {
          local_40.VAL = local_50.VAL;
        }
        else {
          uVar1 = (ulong)((uint)((ulong)local_48 + 0x3f >> 3) & 0xfffffff8);
          local_40.pVal = (uint64_t *)operator_new__(uVar1);
          memcpy(local_40.pVal,local_50.pVal,uVar1);
        }
        APInt::flipAllBits((APInt *)&local_40);
        APInt::operator++((APInt *)&local_40);
        *(uint *)(this + 8) = local_38;
        *(anon_union_8_2_1313ab2f_for_U *)this = local_40;
        local_38 = 0;
        uVar2 = extraout_RDX_04;
      }
      else {
        *(uint *)(this + 8) = local_48;
        if (local_48 < 0x41) {
          *(anon_union_8_2_1313ab2f_for_U *)this = local_50;
          uVar2 = extraout_RDX_01;
        }
        else {
          uVar1 = (ulong)((uint)((ulong)local_48 + 0x3f >> 3) & 0xfffffff8);
          __dest = operator_new__(uVar1);
          *(void **)this = __dest;
          memcpy(__dest,local_50.pVal,uVar1);
          uVar2 = extraout_RDX_03;
        }
      }
      if ((((long)Double < 0) && (0x40 < local_38)) && ((void *)local_40.VAL != (void *)0x0)) {
        operator_delete__(local_40.pVal);
        uVar2 = extraout_RDX_05;
      }
      if ((0x40 < local_48) && ((void *)local_50.VAL != (void *)0x0)) {
        operator_delete__(local_50.pVal);
        uVar2 = extraout_RDX_06;
      }
      goto LAB_0019d99e;
    }
  }
  APInt::APInt((APInt *)this,width,0,false);
  uVar2 = extraout_RDX;
LAB_0019d99e:
  AVar4._8_8_ = uVar2;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt llvm::APIntOps::RoundDoubleToAPInt(double Double, unsigned width) {
  union {
    double D;
    uint64_t I;
  } T;
  T.D = Double;

  // Get the sign bit from the highest order bit
  bool isNeg = T.I >> 63;

  // Get the 11-bit exponent and adjust for the 1023 bit bias
  int64_t exp = ((T.I >> 52) & 0x7ff) - 1023;

  // If the exponent is negative, the value is < 0 so just return 0.
  if (exp < 0)
    return APInt(width, 0u);

  // Extract the mantissa by clearing the top 12 bits (sign + exponent).
  uint64_t mantissa = (T.I & (~0ULL >> 12)) | 1ULL << 52;

  // If the exponent doesn't shift all bits out of the mantissa
  if (exp < 52)
    return isNeg ? -APInt(width, mantissa >> (52 - exp)) :
                    APInt(width, mantissa >> (52 - exp));

  // If the client didn't provide enough bits for us to shift the mantissa into
  // then the result is undefined, just return 0
  if (width <= exp - 52)
    return APInt(width, 0);

  // Otherwise, we have to shift the mantissa bits up to the right location
  APInt Tmp(width, mantissa);
  Tmp <<= (unsigned)exp - 52;
  return isNeg ? -Tmp : Tmp;
}